

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O0

exr_result_t default_read_chunk(exr_decode_pipeline_t *decode)

{
  char *pcVar1;
  long lVar2;
  size_t *in_RDI;
  exr_const_priv_part_t part;
  exr_const_context_t ctxt;
  undefined4 in_stack_00000010;
  exr_result_t rv;
  int in_stack_00000024;
  exr_const_context_t_conflict in_stack_00000028;
  uint in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar3;
  
  pcVar1 = (char *)in_RDI[3];
  if (pcVar1 == (char *)0x0) {
    eVar3 = 2;
  }
  else if (*pcVar1 == '\0') {
    if ((*(int *)((long)in_RDI + 0x14) < 0) ||
       (*(int *)(pcVar1 + 0xc4) <= *(int *)((long)in_RDI + 0x14))) {
      eVar3 = (**(code **)(pcVar1 + 0x48))
                        (pcVar1,4,"Part index (%d) out of range",
                         *(undefined4 *)((long)in_RDI + 0x14));
    }
    else {
      lVar2 = *(long *)(*(long *)(pcVar1 + 0x1d8) + (long)*(int *)((long)in_RDI + 0x14) * 8);
      if ((in_RDI[0x11] == in_RDI[0xf]) && (in_RDI[0x12] == 0)) {
        in_RDI[0x11] = 0;
      }
      if (((*(int *)(lVar2 + 4) == 2) || (*(int *)(lVar2 + 4) == 3)) && (in_RDI[0xb] != 0)) {
        eVar3 = internal_decode_alloc_buffer
                          ((exr_decode_pipeline_t *)ctxt,part._4_4_,
                           (void **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           in_RDI,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
        if (eVar3 == 0) {
          if ((*(ushort *)((long)in_RDI + 0x12) & 4) == 0) {
            eVar3 = internal_decode_alloc_buffer
                              ((exr_decode_pipeline_t *)ctxt,part._4_4_,
                               (void **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8
                                                ),in_RDI,(ulong)in_stack_ffffffffffffffe8);
            if (eVar3 == 0) {
              eVar3 = exr_read_deep_chunk(in_stack_00000028,in_stack_00000024,
                                          (exr_chunk_info_t *)decode,
                                          (void *)CONCAT44(rv,in_stack_00000010),ctxt);
            }
          }
          else {
            eVar3 = exr_read_deep_chunk(in_stack_00000028,in_stack_00000024,
                                        (exr_chunk_info_t *)decode,
                                        (void *)CONCAT44(rv,in_stack_00000010),ctxt);
          }
        }
      }
      else if (in_RDI[8] == 0) {
        eVar3 = 0;
      }
      else {
        eVar3 = internal_decode_alloc_buffer
                          ((exr_decode_pipeline_t *)ctxt,part._4_4_,
                           (void **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           in_RDI,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
        if (eVar3 == 0) {
          eVar3 = exr_read_chunk((exr_const_context_t_conflict)decode,rv,(exr_chunk_info_t *)ctxt,
                                 (void *)CONCAT44(part._4_4_,part._0_4_));
        }
      }
    }
  }
  else {
    eVar3 = (**(code **)(pcVar1 + 0x38))(pcVar1,7);
  }
  return eVar3;
}

Assistant:

static exr_result_t
default_read_chunk (exr_decode_pipeline_t* decode)
{
    exr_result_t        rv;
    exr_const_context_t ctxt = decode->context;
    EXR_READONLY_AND_DEFINE_PART (decode->part_index);

    if (decode->unpacked_buffer == decode->packed_buffer &&
        decode->unpacked_alloc_size == 0)
        decode->unpacked_buffer = NULL;

    if ((part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
         part->storage_mode == EXR_STORAGE_DEEP_TILED) &&
        decode->chunk.sample_count_table_size > 0)
    {
        rv = internal_decode_alloc_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_PACKED_SAMPLES,
            &(decode->packed_sample_count_table),
            &(decode->packed_sample_count_alloc_size),
            decode->chunk.sample_count_table_size);
        if (rv != EXR_ERR_SUCCESS) return rv;

        if ((decode->decode_flags & EXR_DECODE_SAMPLE_DATA_ONLY))
        {
            rv = exr_read_deep_chunk (
                ctxt,
                decode->part_index,
                &(decode->chunk),
                NULL,
                decode->packed_sample_count_table);
        }
        else
        {
            rv = internal_decode_alloc_buffer (
                decode,
                EXR_TRANSCODE_BUFFER_PACKED,
                &(decode->packed_buffer),
                &(decode->packed_alloc_size),
                decode->chunk.packed_size);
            if (rv != EXR_ERR_SUCCESS) return rv;

            rv = exr_read_deep_chunk (
                ctxt,
                decode->part_index,
                &(decode->chunk),
                decode->packed_buffer,
                decode->packed_sample_count_table);
        }
    }
    else if (decode->chunk.packed_size > 0)
    {
        rv = internal_decode_alloc_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_PACKED,
            &(decode->packed_buffer),
            &(decode->packed_alloc_size),
            decode->chunk.packed_size);
        if (rv != EXR_ERR_SUCCESS) return rv;
        rv = exr_read_chunk (
            ctxt, decode->part_index, &(decode->chunk), decode->packed_buffer);
    }
    else
        rv = EXR_ERR_SUCCESS;

    return rv;
}